

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pubkey.cpp
# Opt level: O2

void __thiscall Pubkey_CombineTest_Test::TestBody(Pubkey_CombineTest_Test *this)

{
  char *pcVar1;
  AssertHelper local_290;
  string exp_pk_cp;
  AssertionResult gtest_ar_4;
  string local_258;
  string exp_pk_c2;
  string exp_pk_c2p;
  string exp_pk_c;
  string exp_sk_c;
  Privkey sk_b;
  Pubkey pk_b2;
  Pubkey pk_b1;
  Pubkey pk_a2;
  Pubkey pk_a1;
  Pubkey pk_c2;
  Pubkey pk_b;
  Pubkey pk_a;
  Privkey sk_c;
  Pubkey pk_c14;
  Pubkey pk_c13;
  Pubkey pk_c12;
  Pubkey pk_c11;
  Pubkey pk_c3;
  Pubkey pk_c1;
  Privkey sk_a;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  
  std::__cxx11::string::string
            ((string *)&sk_b,"1d52f68124c59c3125d5c2e043cabf01cef46fafaf45be3132fc1f52ff0ec434",
             (allocator *)&exp_sk_c);
  cfd::core::Privkey::Privkey(&sk_a,(string *)&sk_b,kMainnet,true);
  std::__cxx11::string::~string((string *)&sk_b);
  std::__cxx11::string::string
            ((string *)&exp_sk_c,"353a88e3c404380d9970d9b2d8ee9f6051b3d817ab32aabc12f5c3c65086e659",
             (allocator *)&exp_pk_c);
  cfd::core::Privkey::Privkey(&sk_b,&exp_sk_c,kMainnet,true);
  std::__cxx11::string::~string((string *)&exp_sk_c);
  std::__cxx11::string::string
            ((string *)&exp_sk_c,"528d7f64e8c9d43ebf469c931cb95e6220a847c75a7868ed45f1e3194f95aa8d",
             (allocator *)&exp_pk_c);
  std::__cxx11::string::string
            ((string *)&exp_pk_c,
             "03c6cf31d72599553158c6ffed6139946bbd3a1648a6b1ef56bea812878bb2df71",(allocator *)&sk_c
            );
  cfd::core::Privkey::GetPubkey(&pk_a,&sk_a);
  cfd::core::Privkey::GetPubkey(&pk_b,&sk_b);
  cfd::core::operator+(&pk_c1,&pk_a,&pk_b);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_c2,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_b);
  cfd::core::Pubkey::operator+=((Pubkey *)&local_20,&pk_c2,&pk_a);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_20);
  cfd::core::operator+(&sk_c,&sk_a,&sk_b);
  cfd::core::Privkey::GetPubkey(&pk_c3,&sk_c);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&exp_pk_cp,&pk_c1);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&exp_pk_c2,"exp_pk_c","pk_c1.GetHex()",&exp_pk_c,&exp_pk_cp);
  std::__cxx11::string::~string((string *)&exp_pk_cp);
  if ((char)exp_pk_c2._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&exp_pk_cp);
    if (exp_pk_c2._M_string_length == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)exp_pk_c2._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&exp_pk_c2p,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_pubkey.cpp"
               ,0x118,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&exp_pk_c2p,(Message *)&exp_pk_cp);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&exp_pk_c2p);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&exp_pk_cp);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&exp_pk_c2._M_string_length);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&exp_pk_cp,&pk_c2);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&exp_pk_c2,"exp_pk_c","pk_c2.GetHex()",&exp_pk_c,&exp_pk_cp);
  std::__cxx11::string::~string((string *)&exp_pk_cp);
  if ((char)exp_pk_c2._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&exp_pk_cp);
    if (exp_pk_c2._M_string_length == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)exp_pk_c2._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&exp_pk_c2p,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_pubkey.cpp"
               ,0x119,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&exp_pk_c2p,(Message *)&exp_pk_cp);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&exp_pk_c2p);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&exp_pk_cp);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&exp_pk_c2._M_string_length);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&exp_pk_cp,&pk_c3);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&exp_pk_c2,"exp_pk_c","pk_c3.GetHex()",&exp_pk_c,&exp_pk_cp);
  std::__cxx11::string::~string((string *)&exp_pk_cp);
  if ((char)exp_pk_c2._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&exp_pk_cp);
    if (exp_pk_c2._M_string_length == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)exp_pk_c2._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&exp_pk_c2p,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_pubkey.cpp"
               ,0x11a,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&exp_pk_c2p,(Message *)&exp_pk_cp);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&exp_pk_c2p);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&exp_pk_cp);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&exp_pk_c2._M_string_length);
  cfd::core::Privkey::GetHex_abi_cxx11_(&exp_pk_cp,&sk_c);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&exp_pk_c2,"exp_sk_c","sk_c.GetHex()",&exp_sk_c,&exp_pk_cp);
  std::__cxx11::string::~string((string *)&exp_pk_cp);
  if ((char)exp_pk_c2._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&exp_pk_cp);
    if (exp_pk_c2._M_string_length == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)exp_pk_c2._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&exp_pk_c2p,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_pubkey.cpp"
               ,0x11b,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&exp_pk_c2p,(Message *)&exp_pk_cp);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&exp_pk_c2p);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&exp_pk_cp);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&exp_pk_c2._M_string_length);
  std::__cxx11::string::string
            ((string *)&exp_pk_cp,
             "024d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d",
             (allocator *)&exp_pk_c2);
  cfd::core::Pubkey::Pubkey(&pk_a1,&exp_pk_cp);
  std::__cxx11::string::~string((string *)&exp_pk_cp);
  std::__cxx11::string::string
            ((string *)&exp_pk_cp,
             "034d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d",
             (allocator *)&exp_pk_c2);
  cfd::core::Pubkey::Pubkey(&pk_a2,&exp_pk_cp);
  std::__cxx11::string::~string((string *)&exp_pk_cp);
  std::__cxx11::string::string
            ((string *)&exp_pk_cp,
             "02dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54",
             (allocator *)&exp_pk_c2);
  cfd::core::Pubkey::Pubkey(&pk_b1,&exp_pk_cp);
  std::__cxx11::string::~string((string *)&exp_pk_cp);
  std::__cxx11::string::string
            ((string *)&exp_pk_cp,
             "03dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54",
             (allocator *)&exp_pk_c2);
  cfd::core::Pubkey::Pubkey(&pk_b2,&exp_pk_cp);
  std::__cxx11::string::~string((string *)&exp_pk_cp);
  std::__cxx11::string::string
            ((string *)&exp_pk_cp,
             "02c6cf31d72599553158c6ffed6139946bbd3a1648a6b1ef56bea812878bb2df71",
             (allocator *)&exp_pk_c2);
  std::__cxx11::string::string
            ((string *)&exp_pk_c2,
             "03417885176062c3ae707af06059e7b5e65f733938f818da509eb3e5c4074b8124",
             (allocator *)&exp_pk_c2p);
  std::__cxx11::string::string
            ((string *)&exp_pk_c2p,
             "02417885176062c3ae707af06059e7b5e65f733938f818da509eb3e5c4074b8124",
             (allocator *)&local_258);
  cfd::core::operator+(&pk_c11,&pk_a1,&pk_b1);
  cfd::core::operator+(&pk_c12,&pk_a2,&pk_b1);
  cfd::core::operator+(&pk_c13,&pk_a1,&pk_b2);
  cfd::core::operator+(&pk_c14,&pk_a2,&pk_b2);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_258,&pk_c11);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_4,"exp_pk_cp","pk_c11.GetHex()",&exp_pk_cp,&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&local_258);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_pubkey.cpp"
               ,0x12a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_258);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_258,&pk_c12);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_4,"exp_pk_c2","pk_c12.GetHex()",&exp_pk_c2,&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&local_258);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_pubkey.cpp"
               ,299,pcVar1);
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_258);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_258,&pk_c13);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_4,"exp_pk_c2p","pk_c13.GetHex()",&exp_pk_c2p,&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&local_258);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_pubkey.cpp"
               ,300,pcVar1);
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_258);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_258,&pk_c14);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_4,"exp_pk_c","pk_c14.GetHex()",&exp_pk_c,&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&local_258);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_pubkey.cpp"
               ,0x12d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_258);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_c14);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_c13);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_c12);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_c11);
  std::__cxx11::string::~string((string *)&exp_pk_c2p);
  std::__cxx11::string::~string((string *)&exp_pk_c2);
  std::__cxx11::string::~string((string *)&exp_pk_cp);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_b2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_b1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_a2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_a1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_c3);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk_c);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_c2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_c1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_b);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_a);
  std::__cxx11::string::~string((string *)&exp_pk_c);
  std::__cxx11::string::~string((string *)&exp_sk_c);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk_b);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk_a);
  return;
}

Assistant:

TEST(Pubkey, CombineTest) {
  // https://planethouki.wordpress.com/2018/03/15/pubkey-add-ecdsa/
  Privkey sk_a("1d52f68124c59c3125d5c2e043cabf01cef46fafaf45be3132fc1f52ff0ec434");
  Privkey sk_b("353a88e3c404380d9970d9b2d8ee9f6051b3d817ab32aabc12f5c3c65086e659");
  std::string exp_sk_c = "528d7f64e8c9d43ebf469c931cb95e6220a847c75a7868ed45f1e3194f95aa8d";
  std::string exp_pk_c = "03c6cf31d72599553158c6ffed6139946bbd3a1648a6b1ef56bea812878bb2df71";

  auto pk_a = sk_a.GetPubkey();
  auto pk_b = sk_b.GetPubkey();

  auto pk_c1 = pk_a + pk_b;
  Pubkey pk_c2 = pk_b;
  pk_c2 += pk_a;

  auto sk_c = sk_a + sk_b;
  auto pk_c3 = sk_c.GetPubkey();

  EXPECT_EQ(exp_pk_c, pk_c1.GetHex());
  EXPECT_EQ(exp_pk_c, pk_c2.GetHex());
  EXPECT_EQ(exp_pk_c, pk_c3.GetHex());
  EXPECT_EQ(exp_sk_c, sk_c.GetHex());

  Pubkey pk_a1("024d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d");
  Pubkey pk_a2("034d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d");
  Pubkey pk_b1("02dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54");
  Pubkey pk_b2("03dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54");
  std::string exp_pk_cp = "02c6cf31d72599553158c6ffed6139946bbd3a1648a6b1ef56bea812878bb2df71";
  std::string exp_pk_c2 = "03417885176062c3ae707af06059e7b5e65f733938f818da509eb3e5c4074b8124";
  std::string exp_pk_c2p = "02417885176062c3ae707af06059e7b5e65f733938f818da509eb3e5c4074b8124";

  auto pk_c11 = pk_a1 + pk_b1;
  auto pk_c12 = pk_a2 + pk_b1;
  auto pk_c13 = pk_a1 + pk_b2;
  auto pk_c14 = pk_a2 + pk_b2;

  EXPECT_EQ(exp_pk_cp, pk_c11.GetHex());
  EXPECT_EQ(exp_pk_c2, pk_c12.GetHex());
  EXPECT_EQ(exp_pk_c2p, pk_c13.GetHex());
  EXPECT_EQ(exp_pk_c, pk_c14.GetHex());
}